

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
* vkt::api::anon_unknown_1::CommandBuffer::createMultiple
            (vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
             *__return_storage_ptr__,Environment *env,Resources *res,Parameters *params,
            vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *pOutHandles,
            VkResult *pOutResult)

{
  DeviceInterface *deviceIface;
  VkDevice device;
  Deleter<vk::VkCommandBuffer_s_*> deleter;
  VkResult VVar1;
  size_type sVar2;
  Handle<(vk::HandleType)24> *pHVar3;
  Move<vk::VkCommandBuffer_s*> *this;
  Deleter<vk::VkCommandBuffer_s_*> local_b0;
  Checked<vk::VkCommandBuffer_s_*> local_98;
  SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> local_80;
  uint local_70;
  undefined1 local_69;
  deUint32 i;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  VkCommandBuffer *pHandles;
  deUint32 numCommandBuffers;
  VkResult *pOutResult_local;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *pOutHandles_local;
  Parameters *params_local;
  Resources *res_local;
  Environment *env_local;
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  *commandBuffers;
  
  sVar2 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                    (pOutHandles);
  cmdBufferInfo._24_8_ =
       std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::operator[]
                 (pOutHandles,0);
  i = 0x28;
  cmdBufferInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferInfo._4_4_ = 0;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(res->commandPool).object.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  cmdBufferInfo.pNext = (void *)pHVar3->m_internal;
  cmdBufferInfo.commandPool.m_internal._0_4_ = params->level;
  cmdBufferInfo.commandPool.m_internal._4_4_ = (uint)sVar2;
  VVar1 = (*env->vkd->_vptr_DeviceInterface[0x47])(env->vkd,env->device,&i,cmdBufferInfo._24_8_);
  *pOutResult = VVar1;
  local_69 = 0;
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  ::vector(__return_storage_ptr__);
  if (*pOutResult == VK_SUCCESS) {
    for (local_70 = 0; local_70 < (uint)sVar2; local_70 = local_70 + 1) {
      this = (Move<vk::VkCommandBuffer_s*> *)operator_new(0x20);
      local_98 = ::vk::refdetails::check<vk::VkCommandBuffer_s*>
                           (*(VkCommandBuffer_s **)(cmdBufferInfo._24_8_ + (ulong)local_70 * 8));
      deviceIface = env->vkd;
      device = env->device;
      pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                         (&(res->commandPool).object.super_RefBase<vk::Handle<(vk::HandleType)24>_>)
      ;
      ::vk::refdetails::Deleter<vk::VkCommandBuffer_s_*>::Deleter
                (&local_b0,deviceIface,device,(VkCommandPool)pHVar3->m_internal);
      deleter.m_device = local_b0.m_device;
      deleter.m_deviceIface = local_b0.m_deviceIface;
      deleter.m_pool.m_internal = local_b0.m_pool.m_internal;
      ::vk::refdetails::Move<vk::VkCommandBuffer_s*>::Move<vk::VkCommandBuffer_s*>
                (this,local_98,deleter);
      de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::SharedPtr
                (&local_80,(Move<vk::VkCommandBuffer_s_*> *)this);
      std::
      vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
      ::push_back(__return_storage_ptr__,&local_80);
      de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::~SharedPtr(&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<VkCommandBufferSp> createMultiple (const Environment& env, const Resources& res, const Parameters& params, vector<VkCommandBuffer>* const pOutHandles, VkResult* const pOutResult)
	{
		DE_ASSERT(pOutResult);
		DE_ASSERT(pOutHandles);
		DE_ASSERT(pOutHandles->size() != 0);

		const deUint32						numCommandBuffers	= static_cast<deUint32>(pOutHandles->size());
		VkCommandBuffer* const				pHandles			= &(*pOutHandles)[0];

		const VkCommandBufferAllocateInfo	cmdBufferInfo		=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
			DE_NULL,
			*res.commandPool.object,
			params.level,
			numCommandBuffers,
		};

		*pOutResult = env.vkd.allocateCommandBuffers(env.device, &cmdBufferInfo, pHandles);

		vector<VkCommandBufferSp>	commandBuffers;

		if (*pOutResult == VK_SUCCESS)
		{
			for (deUint32 i = 0; i < numCommandBuffers; ++i)
				commandBuffers.push_back(VkCommandBufferSp(new Move<VkCommandBuffer>(check<VkCommandBuffer>(pHandles[i]), Deleter<VkCommandBuffer>(env.vkd, env.device, *res.commandPool.object))));
		}

		return commandBuffers;
	}